

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void expr_emit_arith(Parser *psr,Tk binop,Node *left,Node right)

{
  _Bool _Var1;
  byte arg2;
  byte arg3;
  _Bool _Var2;
  BcOp BVar3;
  BcIns ins_00;
  int iVar4;
  Function *fn;
  NodeType NVar5;
  Node right_00;
  int idx;
  BcIns ins;
  BcOp opcode;
  uint8_t rarg;
  uint8_t larg;
  Node r;
  Node l;
  Node *result;
  Node *left_local;
  Tk binop_local;
  Parser *psr_local;
  Node right_local;
  
  NVar5 = right.type;
  if (NVar5 != NODE_PRIM) {
    right_00._4_4_ = 0;
    right_00.type = NVar5;
    right_00.field_1 = right.field_1;
    _Var1 = expr_fold_arith(binop,left,right_00);
    if (!_Var1) {
      _Var1 = binop_is_commutative(binop);
      if ((_Var1) && (_Var1 = node_is_const(left), _Var1)) {
        r.field_1.jmp.false_list = psr_local._4_4_;
        r.field_1.prim = NVar5;
        opcode = left->type;
        unique0x00012004 = *(undefined4 *)&left->field_0x4;
        r._0_8_ = left->field_1;
      }
      else {
        r.field_1.prim = left->type;
        r.field_1.jmp.false_list = *(undefined4 *)&left->field_0x4;
        unique0x10000159 = psr_local._4_4_;
        opcode = NVar5;
        r._0_8_ = right.field_1;
      }
      arg2 = expr_to_ins_arg(psr,(Node *)&r.field_1.jmp);
      arg3 = expr_to_ins_arg(psr,(Node *)&opcode);
      if (arg3 < arg2) {
        expr_free_node(psr,(Node *)&r.field_1.jmp);
        expr_free_node(psr,(Node *)&opcode);
      }
      else {
        expr_free_node(psr,(Node *)&opcode);
        expr_free_node(psr,(Node *)&r.field_1.jmp);
      }
      BVar3 = binop_opcode(binop);
      _Var1 = node_is_const((Node *)&opcode);
      _Var2 = node_is_const((Node *)&r.field_1.jmp);
      ins_00 = bc_new3(BVar3 + _Var1 + (uint)_Var2 * 2,'\0',arg2,arg3);
      fn = psr_fn(psr);
      iVar4 = fn_emit(fn,ins_00);
      left->type = NODE_RELOC;
      (left->field_1).reloc_idx = iVar4;
    }
    return;
  }
  psr_trigger_err(psr,"invalid operand to binary operator");
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                ,0x2fa,"void expr_emit_arith(Parser *, Tk, Node *, Node)");
}

Assistant:

static void expr_emit_arith(Parser *psr, Tk binop, Node *left, Node right) {
	// Check for valid operand types
	if (right.type == NODE_PRIM) {
		psr_trigger_err(psr, "invalid operand to binary operator");
		UNREACHABLE();
	}

	// Check if we can fold the arithmetic operation
	if (expr_fold_arith(binop, left, right)) {
		return;
	}

	// If the arithemtic operator is commutative, we need to make sure the
	// constant number is on the right
	Node *result = left;
	Node l, r;
	if (binop_is_commutative(binop) && node_is_const(left)) {
		l = right;
		r = *left;
	} else {
		l = *left;
		r = right;
	}

	// Convert the operands into instruction args
	uint8_t larg = expr_to_ins_arg(psr, &l);
	uint8_t rarg = expr_to_ins_arg(psr, &r);

	// Assuming both left and right represent slots (and not an index into
	// the context's constants array), we need to free temporary slots.
	// Since temporary slots need to be free'd from top down, the order
	// depends on if left or right is the most recently allocated temporary
	// slot
	if (larg > rarg) {
		expr_free_node(psr, &l);
		expr_free_node(psr, &r);
	} else {
		expr_free_node(psr, &r);
		expr_free_node(psr, &l);
	}

	// Calculate the opcode to use off the binary operator
	BcOp opcode = binop_opcode(binop) + node_is_const(&r) +
		node_is_const(&l) * 2;

	// Generate the relocatable bytecode instruction
	BcIns ins = bc_new3(opcode, 0, larg, rarg);
	int idx = fn_emit(psr_fn(psr), ins);

	// Set the result as a relocatable node
	result->type = NODE_RELOC;
	result->reloc_idx = idx;
}